

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::openScope(Parser *this,vardef_t *vardef)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *__stream;
  const_iterator cVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>
  local_68;
  
  (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_68);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
          ::find(&(this->var_table)._M_t,&local_68.first);
  paVar1 = &local_68.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  __stream = _stdout;
  if ((_Rb_tree_header *)cVar2._M_node == &(this->var_table)._M_t._M_impl.super__Rb_tree_header) {
    (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_68);
    fprintf(__stream,"\x1b[33m\t{{{ Variable [%s] open scope\n\x1b[0m",
            local_68.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.first._M_dataplus._M_p,
                      local_68.first.field_2._M_allocated_capacity + 1);
    }
    vardef->defined = true;
    (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_88);
    if (local_88 == &local_78) {
      local_68.first.field_2._8_8_ = local_78._8_8_;
      local_68.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_68.first._M_dataplus._M_p = (pointer)local_88;
    }
    local_68.first.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
    local_68.first.field_2._M_local_buf[0] = local_78._M_local_buf[0];
    local_68.first._M_string_length = local_80;
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_68.second.name = vardef->name;
    local_68.second.defined = vardef->defined;
    local_68.second.isConst = vardef->isConst;
    local_68.second._10_6_ = *(undefined6 *)&vardef->field_0xa;
    local_68.second.type = vardef->type;
    local_88 = &local_78;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Parser::vardef_t>,std::_Select1st<std::pair<std::__cxx11::string_const,Parser::vardef_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Parser::vardef_t>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Parser::vardef_t>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Parser::vardef_t>,std::_Select1st<std::pair<std::__cxx11::string_const,Parser::vardef_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Parser::vardef_t>>>
                *)&this->var_table,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.first._M_dataplus._M_p,
                      local_68.first.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,
                                        local_78._M_local_buf[0]) + 1);
    }
    return;
  }
  (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_68);
  fprintf(__stream,"\x1b[31m\tVariable [%s] already declared.\n\x1b[0m",
          local_68.first._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_68);
  exit(1);
}

Assistant:

void Parser::openScope(vardef_t *vardef) {
    // First check if var exists, if it does, we have a problem
    if (checkVarExists(vardef->name->describe())) {
        fprintf(stdout, ANSI_COLOR_RED "\tVariable [%s] already declared.\n" ANSI_COLOR_RESET,
                vardef->name->describe().data());
        exit(1);
    }

    if (_VERBOSITY >= 3) {
        fprintf(stdout, ANSI_COLOR_YELLOW "\t{{{ Variable [%s] open scope\n" ANSI_COLOR_RESET,
                vardef->name->describe().data());
    }

    // Add to var_table
    vardef->defined = true;
    var_table.insert(std::pair<std::string, vardef_t>(vardef->name->describe(), *vardef));
}